

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O3

tree_node * __thiscall RegexTree::build_block(RegexTree *this,char *str,int num)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  tree_node *ptVar5;
  tree_node *ptVar6;
  tree_node *ptVar7;
  tree_node *ptVar8;
  tree_node *ptVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  
  cVar3 = *str;
  if (cVar3 == '(') {
    cVar3 = str[1];
    iVar12 = -1;
    if (cVar3 != '\0') {
      iVar4 = 1;
      lVar10 = 2;
      do {
        iVar4 = (iVar4 + (uint)(cVar3 == '(')) - (uint)(cVar3 == ')');
        if (iVar4 == 0) {
          iVar12 = (int)lVar10 + -1;
          break;
        }
        cVar3 = str[lVar10];
        lVar10 = lVar10 + 1;
      } while (cVar3 != '\0');
    }
    ptVar5 = build_block(this,str + 1,iVar12 + -1);
    iVar12 = iVar12 + 1;
  }
  else if (cVar3 == '\\') {
    ptVar5 = (tree_node *)operator_new(0x18);
    ptVar5->left = (tree_node *)0x0;
    ptVar5->right = (tree_node *)0x0;
    ptVar5->c = '\x11';
    ptVar6 = (tree_node *)operator_new(0x18);
    ptVar6->left = (tree_node *)0x0;
    ptVar6->right = (tree_node *)0x0;
    ptVar5->left = ptVar6;
    cVar3 = str[1];
    if (cVar3 == 'n') {
      cVar3 = '\n';
    }
    else if (cVar3 == 'r') {
      cVar3 = '\r';
    }
    else if (cVar3 == 't') {
      cVar3 = '\t';
    }
    ptVar6->c = cVar3;
    iVar12 = 2;
  }
  else {
    ptVar5 = (tree_node *)operator_new(0x18);
    ptVar5->left = (tree_node *)0x0;
    ptVar5->right = (tree_node *)0x0;
    ptVar5->c = '\x11';
    ptVar6 = (tree_node *)operator_new(0x18);
    ptVar6->left = (tree_node *)0x0;
    ptVar6->right = (tree_node *)0x0;
    ptVar5->left = ptVar6;
    ptVar6->c = cVar3;
    iVar12 = 1;
  }
  if (iVar12 < num) {
    bVar1 = false;
    ptVar6 = ptVar5;
    do {
      cVar3 = str[iVar12];
      ptVar5 = ptVar6;
      if (cVar3 == '\\') {
        cVar3 = '\\';
        bVar2 = true;
        if (bVar1) {
switchD_00103278_caseD_d:
          if (ptVar6->c == '\x11') {
            ptVar6->c = '\b';
          }
          else {
            ptVar5 = (tree_node *)operator_new(0x18);
            ptVar5->right = (tree_node *)0x0;
            ptVar5->c = '\b';
            ptVar5->left = ptVar6;
          }
          ptVar6 = (tree_node *)operator_new(0x18);
          ptVar6->left = (tree_node *)0x0;
          ptVar6->right = (tree_node *)0x0;
          ptVar5->right = ptVar6;
          ptVar6->c = cVar3;
          goto LAB_001032cc;
        }
      }
      else {
        if (bVar1) {
          if (cVar3 == 'n') goto switchD_00103278_caseD_a;
          if (cVar3 == 'r') {
            cVar3 = '\r';
            goto switchD_00103278_caseD_d;
          }
          if (cVar3 != 't') goto LAB_0010325e;
switchD_00103278_caseD_9:
          if ((ptVar6 == (tree_node *)0x0) || (ptVar6->c != '\x11')) {
            ptVar7 = ptVar6->right;
            if ((ptVar7 == (tree_node *)0x0) || (ptVar7->c != '\x11')) {
              ptVar8 = (tree_node *)operator_new(0x18);
              ptVar8->right = (tree_node *)0x0;
              ptVar8->c = '\t';
              ptVar8->left = ptVar7;
              goto LAB_00103414;
            }
            ptVar7->c = '\t';
          }
          else {
            ptVar6->c = '\t';
          }
        }
        else {
          cVar3 = parse_control(cVar3);
LAB_0010325e:
          switch(cVar3) {
          case '\t':
            goto switchD_00103278_caseD_9;
          case '\n':
switchD_00103278_caseD_a:
            cVar3 = str[(long)iVar12 + 1];
            if (cVar3 == '(') {
              cVar3 = str[(long)iVar12 + 2];
              iVar4 = -1;
              if (cVar3 != '\0') {
                iVar11 = 1;
                lVar10 = 3;
                do {
                  iVar11 = (iVar11 + (uint)(cVar3 == '(')) - (uint)(cVar3 == ')');
                  if (iVar11 == 0) {
                    iVar4 = (int)lVar10 + -2;
                    break;
                  }
                  cVar3 = str[lVar10 + iVar12];
                  lVar10 = lVar10 + 1;
                } while (cVar3 != '\0');
              }
              ptVar7 = build_block(this,str + (long)iVar12 + 2,iVar4 + -1);
              iVar12 = iVar12 + 1 + iVar4;
            }
            else if (cVar3 == '\\') {
              ptVar7 = (tree_node *)operator_new(0x18);
              ptVar7->left = (tree_node *)0x0;
              ptVar7->right = (tree_node *)0x0;
              cVar3 = str[(long)iVar12 + 2];
              if (cVar3 == 'n') {
                cVar3 = '\n';
              }
              else if (cVar3 == 'r') {
                cVar3 = '\r';
              }
              else if (cVar3 == 't') {
                cVar3 = '\t';
              }
              ptVar7->c = cVar3;
              iVar12 = iVar12 + 2;
            }
            else {
              ptVar7 = (tree_node *)operator_new(0x18);
              ptVar7->left = (tree_node *)0x0;
              ptVar7->right = (tree_node *)0x0;
              ptVar7->c = cVar3;
              iVar12 = iVar12 + 1;
            }
            if ((ptVar6 == (tree_node *)0x0) || (ptVar6->c != '\x11')) {
              ptVar9 = ptVar6->right;
              if ((ptVar9 == (tree_node *)0x0) || (ptVar9->c != '\x11')) {
                ptVar8 = (tree_node *)operator_new(0x18);
                ptVar8->c = '\n';
                ptVar8->left = ptVar9;
                ptVar6->right = ptVar8;
                ptVar8->right = ptVar7;
                goto LAB_001032cc;
              }
LAB_00103618:
              ptVar9->c = '\n';
              ptVar9->right = ptVar7;
              goto LAB_001032cc;
            }
LAB_001035f7:
            ptVar6->c = '\n';
            break;
          case '\v':
            if ((ptVar6 == (tree_node *)0x0) || (ptVar6->c != '\x11')) {
              ptVar7 = ptVar6->right;
              if ((ptVar7 == (tree_node *)0x0) || (ptVar7->c != '\x11')) {
                ptVar9 = (tree_node *)operator_new(0x18);
                ptVar9->left = (tree_node *)0x0;
                ptVar9->right = (tree_node *)0x0;
                ptVar9->c = '\b';
                ptVar8 = (tree_node *)operator_new(0x18);
                ptVar8->left = (tree_node *)0x0;
                ptVar8->right = (tree_node *)0x0;
                ptVar8->c = '\t';
                ptVar9->right = ptVar8;
                ptVar9->left = ptVar7;
                ptVar7 = copy_tree(this,ptVar7);
                ptVar8->left = ptVar7;
                ptVar6->right = ptVar9;
              }
              else {
                ptVar7->c = '\b';
                ptVar6 = (tree_node *)operator_new(0x18);
                ptVar6->left = (tree_node *)0x0;
                ptVar6->right = (tree_node *)0x0;
                ptVar6->c = '\t';
                ptVar9 = copy_tree(this,ptVar7->left);
                ptVar6->left = ptVar9;
                ptVar7->right = ptVar6;
              }
              goto LAB_001032cc;
            }
            ptVar6->c = '\b';
            ptVar7 = (tree_node *)operator_new(0x18);
            ptVar7->left = (tree_node *)0x0;
            ptVar7->right = (tree_node *)0x0;
            ptVar7->c = '\t';
            ptVar9 = copy_tree(this,ptVar6->left);
            ptVar7->left = ptVar9;
            break;
          case '\f':
            ptVar7 = (tree_node *)operator_new(0x18);
            ptVar7->left = (tree_node *)0x0;
            ptVar7->right = (tree_node *)0x0;
            ptVar7->c = '\a';
            if ((ptVar6 != (tree_node *)0x0) && (ptVar6->c == '\x11')) goto LAB_001035f7;
            ptVar9 = ptVar6->right;
            if ((ptVar9 != (tree_node *)0x0) && (ptVar9->c == '\x11')) goto LAB_00103618;
            ptVar8 = (tree_node *)operator_new(0x18);
            ptVar8->c = '\n';
            ptVar8->left = ptVar9;
            ptVar8->right = ptVar7;
LAB_00103414:
            ptVar6->right = ptVar8;
            goto LAB_001032cc;
          default:
            goto switchD_00103278_caseD_d;
          case '\x11':
            cVar3 = str[(long)iVar12 + 1];
            iVar4 = -1;
            if (cVar3 != '\0') {
              iVar11 = 1;
              lVar10 = 2;
              do {
                iVar11 = (iVar11 + (uint)(cVar3 == '(')) - (uint)(cVar3 == ')');
                if (iVar11 == 0) {
                  iVar4 = (int)lVar10 + -1;
                  break;
                }
                cVar3 = str[lVar10 + iVar12];
                lVar10 = lVar10 + 1;
              } while (cVar3 != '\0');
            }
            ptVar7 = build_block(this,str + (long)iVar12 + 1,iVar4 + -1);
            if ((ptVar6 == (tree_node *)0x0) || (ptVar6->c != '\x11')) {
              ptVar5 = (tree_node *)operator_new(0x18);
              ptVar5->c = '\b';
              ptVar5->left = ptVar6;
            }
            else {
              ptVar6->c = '\b';
            }
            ptVar5->right = ptVar7;
            iVar12 = iVar4 + iVar12;
            bVar2 = false;
            goto LAB_001032ce;
          }
          ptVar6->right = ptVar7;
        }
LAB_001032cc:
        bVar2 = false;
      }
LAB_001032ce:
      bVar1 = bVar2;
      iVar12 = iVar12 + 1;
      ptVar6 = ptVar5;
    } while (iVar12 < num);
  }
  ptVar6 = (tree_node *)operator_new(0x18);
  ptVar6->right = (tree_node *)0x0;
  ptVar6->c = '\x11';
  ptVar6->left = ptVar5;
  return ptVar6;
}

Assistant:

tree_node *RegexTree::build_block(const char *str, int num) {
    tree_node *curr;
    int i = 0;
    bool escape = false;

    if (str[i] != '\\' && str[i] != '(') {
        curr = new tree_node;
        curr->c = BLOCK;

        curr->left = new tree_node;
        curr->left->c = str[i];
        i++;
    } else if (str[i] == '\\') {
        curr = new tree_node;
        curr->c = BLOCK;

        curr->left = new tree_node;
        curr->left->c = parse_escape(str[i + 1]);
        i += 2;
    } else {
        int blen = block_len(str + 1);
        curr = build_block(str + 1, blen - 1);
        i += blen + 1;
    }


    for (; i < num; i++) {
        char ch = str[i];
        if (str[i] == '\\' && !escape) {
            escape = true;
            continue;
        }

        if (!escape) {
            ch = parse_control(ch);
        } else {
            ch = parse_escape(ch);
        }

        escape = false;
        switch (ch) {
            case STAR: {
                if (isBlock(curr))
                    curr->c = STAR;
                else {
                    tree_node *tmp = curr->right;
                    if (isBlock(tmp))
                        tmp->c = STAR;
                    else {
                        tree_node *star = new tree_node;
                        star->c = STAR;
                        star->left = tmp;
                        curr->right = star;
                    }
                }
                break;
            }
            case QUESTION: {
                tree_node *epsilon = new tree_node;
                epsilon->c = EPSILON;
                if (isBlock(curr)) {
                    curr->c = OR;
                    curr->right = epsilon;
                } else {
                    tree_node *tmp = curr->right;
                    if (isBlock(tmp)) {
                        tmp->c = OR;
                        tmp->right = epsilon;
                    } else {
                        tree_node *_or = new tree_node;
                        _or->c = OR;
                        _or->left = tmp;
                        _or->right = epsilon;
                        curr->right = _or;
                    }
                }
                break;
            }
            case PLUS: {
                if (isBlock(curr)) {
                    curr->c = CAT;

                    tree_node *star = new tree_node;
                    star->c = STAR;
                    star->left = copy_tree(curr->left);
                    curr->right = star;
                } else {
                    tree_node *tmp = curr->right;
                    if (isBlock(tmp)) {
                        tmp->c = CAT;

                        tree_node *star = new tree_node;
                        star->c = STAR;
                        star->left = copy_tree(tmp->left);
                        tmp->right = star;
                    } else {
                        tree_node *cat = new tree_node;
                        cat->c = CAT;

                        tree_node *star = new tree_node;
                        star->c = STAR;

                        cat->right = star;
                        cat->left = tmp;

                        star->left = copy_tree(tmp);
                        curr->right = cat;
                    }
                }
                break;
            }
            case OR: {
                tree_node *right_side;
                if (str[i + 1] != '\\' && str[i + 1] != '(') { // normal char
                    right_side = new tree_node;
                    right_side->c = str[i + 1];
                    i++;
                } else if (str[i + 1] == '\\') { // escape char
                    right_side = new tree_node;
                    right_side->c = parse_escape(str[i + 2]);
                    i += 2;
                } else { // a block
                    int blen = block_len(str + i + 2);
                    right_side = build_block(str + i + 2, blen - 1);
                    i += blen + 1;
                }

                if (isBlock(curr)) {
                    curr->c = OR;
                    curr->right = right_side;
                } else {
                    tree_node *tmp = curr->right;
                    if (isBlock(tmp)) {
                        tmp->c = OR;
                        tmp->right = right_side;
                    } else {
                        tree_node *_or = new tree_node;
                        _or->c = OR;
                        _or->left = tmp;

                        curr->right = _or;
                        _or->right = right_side;
                    }
                }
                break;
            }
            case BLOCK: {
                tree_node *right_side;
                int blen = block_len(str + i + 1);
                right_side = build_block(str + i + 1, blen - 1);
                if (isBlock(curr)) {
                    curr->c = CAT;
                    curr->right = right_side;
                } else {
                    tree_node *cat = new tree_node;
                    cat->c = CAT;
                    cat->left = curr;
                    curr = cat;
                    curr->right = right_side;
                }
                i += blen;
                break;
            }

            case WILDCARD:
            default: {
                if (curr->c == BLOCK)
                    curr->c = CAT;
                else {
                    tree_node *cat = new tree_node;
                    cat->c = CAT;
                    cat->left = curr;
                    curr = cat;
                }
                curr->right = new tree_node;
                curr->right->c = ch;
                break;
            }
        }
    }

    tree_node *block = new tree_node;
    block->c = BLOCK;
    block->left = curr;
    return block;
}